

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device5.c
# Opt level: O3

void device6(void *arg)

{
  int line;
  int line_00;
  int iVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  int sock;
  int sock_00;
  
  line = test_socket_impl((char *)0x3f,2,0x31,in_ECX);
  test_connect_impl((char *)0x40,line,0x104180,(char *)CONCAT44(in_register_0000000c,in_ECX));
  line_00 = test_socket_impl((char *)0x41,2,0x30,in_ECX);
  test_bind_impl((char *)0x42,line_00,0x104200,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar1 = nn_device(line,line_00);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      test_close_impl((char *)0x49,line,sock);
      test_close_impl((char *)0x4a,line_00,sock_00);
      return;
    }
  }
  device6_cold_1();
}

Assistant:

void device6 (NN_UNUSED void *arg)
{
    int rc;
    int dev2;
    int dev3;

    dev2 = test_socket (AF_SP_RAW, NN_REP);
    test_connect (dev2, socket_address_i);
    dev3 = test_socket (AF_SP_RAW, NN_REQ);
    test_bind (dev3, socket_address_j);

    /*  Run the device. */
    rc = nn_device (dev2, dev3);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (dev2);
    test_close (dev3);
}